

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  uint *puVar4;
  bool *pbVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  Format FVar9;
  string *psVar10;
  int *piVar11;
  LineOrder *pLVar12;
  Box2i *pBVar13;
  uint *puVar14;
  Compression *pCVar15;
  Compressor *pCVar16;
  LineBuffer *pLVar17;
  bool *pbVar18;
  char *pcVar19;
  ChannelList *this_00;
  const_iterator cVar20;
  ConstIterator CVar21;
  ostream *poVar22;
  ArgExc *pAVar23;
  Data *pDVar24;
  long lVar25;
  Data *pDVar26;
  ulong uVar27;
  ulong uVar28;
  ConstIterator tmp;
  long lVar29;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  psVar10 = Header::type_abi_cxx11_(header);
  __n = psVar10->_M_string_length;
  if (__n == _DAT_003da718) {
    if (__n != 0) {
      iVar7 = bcmp((psVar10->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
      if (iVar7 != 0) goto LAB_0016025c;
    }
    if (this->_data->partNumber != -1) {
LAB_0015fdd6:
      piVar11 = Header::version(header);
      if (*piVar11 != 1) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Version ",8);
        piVar11 = Header::version(header);
        poVar22 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*piVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22," not supported for deepscanline images in this version of the library",
                   0x45);
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
        __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      Header::operator=(&this->_data->header,header);
      pLVar12 = Header::lineOrder(&this->_data->header);
      pDVar26 = this->_data;
      pDVar26->lineOrder = *pLVar12;
      pBVar13 = Header::dataWindow(&pDVar26->header);
      iVar7 = (pBVar13->min).x;
      pDVar26 = this->_data;
      pDVar26->minX = iVar7;
      iVar1 = (pBVar13->max).x;
      pDVar26->maxX = iVar1;
      iVar2 = (pBVar13->min).y;
      pDVar26->minY = iVar2;
      iVar3 = (pBVar13->max).y;
      pDVar26->maxY = iVar3;
      lVar29 = (long)((iVar1 - iVar7) + 1);
      uVar8 = iVar3 - iVar2;
      uVar28 = (ulong)uVar8;
      lVar25 = (long)(int)(uVar8 + 1);
      uVar27 = lVar25 * lVar29;
      pDVar24 = pDVar26;
      if (uVar27 < 0x10000001) {
        puVar14 = (uint *)operator_new__(uVar27 * 4);
        puVar4 = (pDVar26->sampleCount)._data;
        if (puVar4 != (uint *)0x0) {
          operator_delete__(puVar4);
          pDVar24 = this->_data;
        }
        (pDVar26->sampleCount)._sizeX = lVar25;
        (pDVar26->sampleCount)._sizeY = lVar29;
        (pDVar26->sampleCount)._data = puVar14;
        uVar28 = (long)pDVar24->maxY - (long)pDVar24->minY;
        lVar25 = uVar28 + 1;
      }
      else {
        pDVar26->bigFile = true;
      }
      uVar27 = 0xffffffffffffffff;
      if (-2 < (int)uVar28) {
        uVar27 = lVar25 * 4;
      }
      puVar14 = (uint *)operator_new__(uVar27);
      puVar4 = (pDVar24->lineSampleCount)._data;
      pDVar26 = pDVar24;
      if (puVar4 != (uint *)0x0) {
        operator_delete__(puVar4);
        pDVar26 = this->_data;
      }
      (pDVar24->lineSampleCount)._size = lVar25;
      (pDVar24->lineSampleCount)._data = puVar14;
      pCVar15 = Header::compression(&pDVar26->header);
      pCVar16 = newCompressor(*pCVar15,0,&this->_data->header);
      iVar7 = numLinesInBuffer(pCVar16);
      pDVar26 = this->_data;
      pDVar26->linesInBuffer = iVar7;
      if (pCVar16 != (Compressor *)0x0) {
        (*pCVar16->_vptr_Compressor[1])(pCVar16);
        pDVar26 = this->_data;
        iVar7 = pDVar26->linesInBuffer;
      }
      pDVar26->nextLineBufferMinY = pDVar26->minY + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&pDVar26->lineOffsets,
                 (long)((((pBVar13->max).y - (pBVar13->min).y) + iVar7) / iVar7));
      pDVar26 = this->_data;
      if ((pDVar26->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pDVar26->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar28 = 0;
        do {
          pLVar17 = (LineBuffer *)operator_new(0xa0);
          pLVar17->compressor = (Compressor *)0x0;
          pLVar17->uncompressedData = (char *)0x0;
          pLVar17->buffer = (char *)0x0;
          pLVar17->packedDataSize = 0;
          FVar9 = defaultFormat((Compressor *)0x0);
          pLVar17->format = FVar9;
          pLVar17->number = -1;
          pLVar17->hasException = false;
          (pLVar17->exception)._M_dataplus._M_p = (pointer)&(pLVar17->exception).field_2;
          (pLVar17->exception)._M_string_length = 0;
          (pLVar17->exception).field_2._M_local_buf[0] = '\0';
          (pLVar17->_tempCountBuffer)._sizeX = 0;
          (pLVar17->_tempCountBuffer)._sizeY = 0;
          (pLVar17->_tempCountBuffer)._data = (uint *)0x0;
          IlmThread_3_2::Semaphore::Semaphore(&pLVar17->_sem,1);
          (this->_data->lineBuffers).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar28] = pLVar17;
          uVar28 = uVar28 + 1;
          pDVar26 = this->_data;
        } while (uVar28 < (ulong)((long)(pDVar26->lineBuffers).
                                        super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pDVar26->lineBuffers).
                                        super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      uVar28 = (ulong)((pDVar26->maxY - pDVar26->minY) + 1);
      pbVar18 = (bool *)operator_new__(uVar28);
      pbVar5 = (pDVar26->gotSampleCount)._data;
      pDVar24 = pDVar26;
      if (pbVar5 != (bool *)0x0) {
        operator_delete__(pbVar5);
        pDVar24 = this->_data;
      }
      (pDVar26->gotSampleCount)._size = uVar28;
      (pDVar26->gotSampleCount)._data = pbVar18;
      iVar7 = pDVar24->maxY;
      iVar1 = pDVar24->minY;
      if (iVar1 <= iVar7) {
        memset((pDVar24->gotSampleCount)._data,0,(ulong)((iVar7 - iVar1) + 1));
      }
      lVar29 = ((long)iVar7 - (long)iVar1) + 1;
      lVar25 = (long)pDVar24->linesInBuffer;
      if (lVar29 < pDVar24->linesInBuffer) {
        lVar25 = lVar29;
      }
      lVar25 = lVar25 * (((long)pDVar24->maxX - (long)pDVar24->minX) + 1);
      lVar29 = lVar25 * 4;
      if (lVar29 < 0x80000000) {
        pDVar24->maxSampleCountTableSize = (int)lVar29;
        uVar28 = (lVar25 << 0x22) >> 0x20;
        pcVar19 = (char *)operator_new__(uVar28);
        pcVar6 = (pDVar24->sampleCountTableBuffer)._data;
        pDVar26 = pDVar24;
        if (pcVar6 != (char *)0x0) {
          operator_delete__(pcVar6);
          pDVar26 = this->_data;
        }
        (pDVar24->sampleCountTableBuffer)._size = uVar28;
        (pDVar24->sampleCountTableBuffer)._data = pcVar19;
        pCVar15 = Header::compression(&pDVar26->header);
        pCVar16 = newCompressor(*pCVar15,(long)this->_data->maxSampleCountTableSize,
                                &this->_data->header);
        pDVar26 = this->_data;
        pDVar26->sampleCountTableComp = pCVar16;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&pDVar26->bytesPerLine,(long)((pDVar26->maxY - pDVar26->minY) + 1));
        this_00 = Header::channels(header);
        this->_data->combinedSampleSize = 0;
        cVar20._M_node = (_Base_ptr)ChannelList::begin(this_00);
        while( true ) {
          CVar21 = ChannelList::end(this_00);
          if ((const_iterator)cVar20._M_node == CVar21._i._M_node) {
            return;
          }
          if (2 < (ulong)cVar20._M_node[9]._M_color) break;
          piVar11 = &this->_data->combinedSampleSize;
          *piVar11 = *piVar11 + *(int *)(&DAT_0020428c + (ulong)cVar20._M_node[9]._M_color * 4);
          cVar20._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar20._M_node);
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Bad type for channel ",0x15);
        poVar22 = std::operator<<(local_1a8,(char *)(cVar20._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22," initializing deepscanline reader",0x21);
        pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
        __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Deep scanline image size ",0x19)
      ;
      poVar22 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," x ",3);
      poVar22 = std::ostream::_M_insert<long>((long)poVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," exceeds maximum size",0x15);
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar23,local_1b8);
      __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    uVar8 = this->_data->version;
    if ((uVar8 >> 9 & 1) == 0) {
      if ((uVar8 >> 0xb & 1) != 0) goto LAB_0015fdd6;
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar23,"Expected a deep scanline file but the file is not a deep image.");
    }
    else {
      pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar23,"Expected a deep scanline file but the file is tiled.");
    }
  }
  else {
LAB_0016025c:
    pAVar23 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar23,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
  }
  __cxa_throw(pAVar23,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::initialize (const Header& header)
{
    try
    {
        if (header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineInputFile from "
                "a type-mismatched part.");

        if (_data->partNumber == -1)
        {
            if (isTiled (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is tiled.");

            if (!isNonImage (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is not a deep image.");
        }

        if (header.version () != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Version "
                    << header.version ()
                    << " not supported for deepscanline images in this version of the library");
        }

        _data->header = header;

        _data->lineOrder = _data->header.lineOrder ();

        const Box2i& dataWindow = _data->header.dataWindow ();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        if (static_cast<uint64_t> (_data->maxX - _data->minX + 1) *
                static_cast<uint64_t> (_data->maxY - _data->minY + 1) >
            gBigFileDataWindowSize)
        {
            _data->bigFile = true;
        }
        else
        {
            _data->sampleCount.resizeErase (
                _data->maxY - _data->minY + 1, _data->maxX - _data->minX + 1);
        }
        _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

        Compressor* compressor =
            newCompressor (_data->header.compression (), 0, _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize =
            (dataWindow.max.y - dataWindow.min.y + _data->linesInBuffer) /
            _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size (); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase (_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        int64_t imageHeight = static_cast<int64_t>(_data->maxY) - static_cast<int64_t>(_data->minY) + 1;
        int64_t imageWidth = static_cast<int64_t>(_data->maxX) - static_cast<int64_t>(_data->minX) +1;

        int64_t tableSize =  min (static_cast<int64_t>(_data->linesInBuffer), imageHeight) * imageWidth
            * sizeof (unsigned int);

        if (tableSize>std::numeric_limits<int>::max() )
        {
             THROW (IEX_NAMESPACE::ArgExc,
                    "Deep scanline image size "
                    << imageWidth << " x " <<  imageHeight
                    << " exceeds maximum size");
        }
        _data->maxSampleCountTableSize =tableSize;



        _data->sampleCountTableBuffer.resizeErase (
            _data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

        const ChannelList& c = header.channels ();

        _data->combinedSampleSize = 0;
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            switch (i.channel ().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    _data->combinedSampleSize += Xdr::size<half> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    _data->combinedSampleSize += Xdr::size<float> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    _data->combinedSampleSize += Xdr::size<unsigned int> ();
                    break;
                default:
                    THROW (
                        IEX_NAMESPACE::ArgExc,
                        "Bad type for channel "
                            << i.name ()
                            << " initializing deepscanline reader");
            }
        }
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}